

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

char * lj_strfmt_wint(char *p,int32_t k)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint32_t u;
  int iVar4;
  
  if (k < 0) {
    k = -k;
    *p = '-';
    p = p + 1;
  }
  if ((uint)k < 10000) {
    if ((uint)k < 10) goto LAB_00111cf4;
    if (99 < (uint)k) {
      if (999 < (uint)k) goto LAB_00111cb8;
      goto LAB_00111cd0;
    }
  }
  else {
    uVar2 = (ulong)(uint)k / 10000;
    iVar3 = (int)uVar2;
    iVar4 = iVar3 * -10000;
    if ((uint)k < 100000000) {
      if (99999 < (uint)k) {
        if (999999 < (uint)k) {
          if (9999999 < (uint)k) goto LAB_00111c71;
          goto LAB_00111c89;
        }
        goto LAB_00111c9b;
      }
    }
    else {
      uVar2 = (ulong)(uint)k / 100000000;
      uVar1 = (uint)uVar2;
      if (999999999 < (uint)k) {
        uVar2 = (ulong)(uVar1 % 10);
        *p = (byte)(uVar1 / 10) | 0x30;
        p = (char *)((byte *)p + 1);
      }
      iVar3 = iVar3 + uVar1 * -10000;
      *p = (char)uVar2 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_00111c71:
      uVar1 = (uint)(iVar3 * 0x20c5) >> 0x17;
      iVar3 = iVar3 + uVar1 * -1000;
      *p = (char)uVar1 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_00111c89:
      uVar1 = (uint)(iVar3 * 0x29) >> 0xc;
      iVar3 = iVar3 + uVar1 * -100;
      *p = (char)uVar1 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_00111c9b:
      uVar1 = (uint)(iVar3 * 0x67) >> 10;
      uVar2 = (ulong)(iVar3 + uVar1 * -10);
      *p = (char)uVar1 + 0x30;
      p = (char *)((byte *)p + 1);
    }
    k = k + iVar4;
    *p = (char)uVar2 + 0x30;
    p = (char *)((byte *)p + 1);
LAB_00111cb8:
    uVar1 = (uint)(k * 0x20c5) >> 0x17;
    k = k + uVar1 * -1000;
    *p = (char)uVar1 + 0x30;
    p = (char *)((byte *)p + 1);
LAB_00111cd0:
    uVar1 = (uint)(k * 0x29) >> 0xc;
    k = k + uVar1 * -100;
    *p = (char)uVar1 + 0x30;
    p = (char *)((byte *)p + 1);
  }
  uVar1 = (uint)(k * 0x67) >> 10;
  k = k + uVar1 * -10;
  *p = (char)uVar1 + 0x30;
  p = (char *)((byte *)p + 1);
LAB_00111cf4:
  *p = (char)k + 0x30;
  return (char *)((byte *)p + 1);
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wint(char *p, int32_t k)
{
  uint32_t u = (uint32_t)k;
  if (k < 0) { u = ~u+1u; *p++ = '-'; }
  if (u < 10000) {
    if (u < 10) goto dig1;
    if (u < 100) goto dig2;
    if (u < 1000) goto dig3;
  } else {
    uint32_t v = u / 10000; u -= v * 10000;
    if (v < 10000) {
      if (v < 10) goto dig5;
      if (v < 100) goto dig6;
      if (v < 1000) goto dig7;
    } else {
      uint32_t w = v / 10000; v -= w * 10000;
      if (w >= 10) WINT_R(w, 10, 10)
      *p++ = (char)('0'+w);
    }
    WINT_R(v, 23, 1000)
    dig7: WINT_R(v, 12, 100)
    dig6: WINT_R(v, 10, 10)
    dig5: *p++ = (char)('0'+v);
  }
  WINT_R(u, 23, 1000)
  dig3: WINT_R(u, 12, 100)
  dig2: WINT_R(u, 10, 10)
  dig1: *p++ = (char)('0'+u);
  return p;
}